

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stop_Freeze_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Stop_Freeze_PDU::Encode(Stop_Freeze_PDU *this,KDataStream *stream)

{
  Simulation_Management_Header::Encode(&this->super_Simulation_Management_Header,stream);
  (*(this->m_RealWorldTime).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_RealWorldTime,stream)
  ;
  KDataStream::Write(stream,this->m_ui8Reason);
  KDataStream::Write(stream,this->m_ui8FrozenBehaviour);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32RequestID);
  return;
}

Assistant:

void Stop_Freeze_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );
    stream << KDIS_STREAM m_RealWorldTime
           << m_ui8Reason
           << m_ui8FrozenBehaviour
           << m_ui16Padding
           << m_ui32RequestID;
}